

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O1

uchar * __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,0ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
::finalize<unsigned_char*>
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,0ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
           *this,uchar *first)

{
  int iVar1;
  ptrdiff_t _Num;
  ulong __n;
  uint written;
  uint8_t buffer [64];
  uint local_5c;
  uchar local_58 [72];
  
  iVar1 = EVP_DigestFinal_ex(*(EVP_MD_CTX **)this,local_58,&local_5c);
  if (iVar1 != 1) {
    local_5c = 0;
  }
  __n = (ulong)local_5c;
  if (__n != 0) {
    memcpy(first,local_58,__n);
  }
  return first + __n;
}

Assistant:

Output finalize(Output first) {
			std::uint8_t buffer[2*EVP_MAX_BLOCK_LENGTH];

			unsigned int written;
			if (FinalFx(_context, buffer, &written) != 1)
				written = 0;

			return std::copy(buffer, buffer + written, first);
		}